

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstantValue * __thiscall
slang::TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
          (TypedBumpAllocator<slang::ConstantValue> *this,ConstantValue *args)

{
  ConstantValue *pCVar1;
  ConstantValue *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ConstantValue *)BumpAllocator::allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::ConstantValue::ConstantValue(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }